

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imglsadf.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1bd4::InputSourcePreprocessingForMelCepstrum::
InputSourcePreprocessingForMelCepstrum
          (InputSourcePreprocessingForMelCepstrum *this,double alpha,double gamma,bool gain_flag,
          InputSourceInterface *source)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  _func_int **in_RDX;
  byte in_SIL;
  InputSourceInterface *in_RDI;
  _func_int **in_XMM1_Qa;
  undefined5 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff95;
  undefined1 in_stack_ffffffffffffff96;
  undefined1 in_stack_ffffffffffffff97;
  undefined8 in_stack_ffffffffffffff98;
  int num_order;
  undefined4 in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  
  num_order = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  sptk::InputSourceInterface::InputSourceInterface(in_RDI);
  in_RDI->_vptr_InputSourceInterface =
       (_func_int **)&PTR__InputSourcePreprocessingForMelCepstrum_0012baa0;
  in_RDI[1]._vptr_InputSourceInterface = in_XMM1_Qa;
  *(byte *)&in_RDI[2]._vptr_InputSourceInterface = in_SIL & 1;
  in_RDI[3]._vptr_InputSourceInterface = in_RDX;
  if (in_RDX != (_func_int **)0x0) {
    (**(code **)(*in_RDX + 0x10))();
  }
  sptk::MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
            ((MelCepstrumToMlsaDigitalFilterCoefficients *)
             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),num_order,
             (double)CONCAT17(in_stack_ffffffffffffff97,
                              CONCAT16(in_stack_ffffffffffffff96,
                                       CONCAT15(in_stack_ffffffffffffff95,in_stack_ffffffffffffff90)
                                      )));
  if (in_RDX == (_func_int **)0x0) {
    iVar3 = 0;
  }
  else {
    in_stack_ffffffffffffffa4 = (**(code **)(*in_RDX + 0x10))();
    iVar3 = in_stack_ffffffffffffffa4 + -1;
  }
  sptk::GeneralizedCepstrumGainNormalization::GeneralizedCepstrumGainNormalization
            ((GeneralizedCepstrumGainNormalization *)CONCAT44(in_stack_ffffffffffffffa4,iVar3),
             num_order,
             (double)CONCAT17(in_stack_ffffffffffffff97,
                              CONCAT16(in_stack_ffffffffffffff96,
                                       CONCAT15(in_stack_ffffffffffffff95,in_stack_ffffffffffffff90)
                                      )));
  *(undefined1 *)&in_RDI[0xc]._vptr_InputSourceInterface = 1;
  _GLOBAL__N_1::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10605f);
  if ((((in_RDX == (_func_int **)0x0) || (bVar1 = (**(code **)(*in_RDX + 0x18))(), (bVar1 & 1) == 0)
       ) || (bVar2 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::IsValid
                               ((MelCepstrumToMlsaDigitalFilterCoefficients *)(in_RDI + 4)), !bVar2)
      ) || (bVar2 = sptk::GeneralizedCepstrumGainNormalization::IsValid
                              ((GeneralizedCepstrumGainNormalization *)(in_RDI + 8)), !bVar2)) {
    *(undefined1 *)&in_RDI[0xc]._vptr_InputSourceInterface = 0;
  }
  return;
}

Assistant:

InputSourcePreprocessingForMelCepstrum(double alpha, double gamma,
                                         bool gain_flag,
                                         sptk::InputSourceInterface* source)
      : gamma_(gamma),
        gain_flag_(gain_flag),
        source_(source),
        mel_cepstrum_to_mlsa_digital_filter_coefficients_(
            source ? source->GetSize() - 1 : 0, alpha),
        generalized_cepstrum_gain_normalization_(
            source ? source->GetSize() - 1 : 0, gamma),
        is_valid_(true) {
    if (NULL == source || !source->IsValid() ||
        !mel_cepstrum_to_mlsa_digital_filter_coefficients_.IsValid() ||
        !generalized_cepstrum_gain_normalization_.IsValid()) {
      is_valid_ = false;
      return;
    }
  }